

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86.cpp
# Opt level: O0

int __thiscall ncnn::SELU_x86::forward_inplace(SELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long *in_RSI;
  long in_RDI;
  float fVar4;
  int iVar5;
  float fVar9;
  float fVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar11;
  float alphaxlambda;
  __m128 _blob;
  __m128 _neg;
  __m128 _pos;
  __m128 _p;
  __m128 _lambda128;
  __m128 _alpha128;
  __m128 _one128;
  __m128 _zero128;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  int local_808;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined4 local_7e0;
  long local_7d8;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined8 local_7b8;
  undefined1 (*local_7b0) [16];
  int local_7a4;
  int local_7a0;
  int local_79c;
  int local_798;
  int local_794;
  int local_790;
  int local_78c;
  long *local_780;
  undefined1 local_76d;
  int local_76c;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_718;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_6ec;
  undefined4 local_6e8;
  undefined4 uStack_6e4;
  undefined4 uStack_6e0;
  undefined4 uStack_6dc;
  undefined4 local_6d4;
  undefined1 (*local_6d0) [16];
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 (*local_460) [16];
  long local_458;
  undefined4 local_44c;
  long local_448;
  undefined1 (*local_440) [16];
  undefined4 local_434;
  int local_430;
  int local_42c;
  undefined8 *local_428;
  undefined4 local_41c;
  long local_418;
  undefined8 *local_3f8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined8 *local_350;
  float *local_348;
  float *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8 [2];
  float afStack_1f0 [2];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198 [2];
  float afStack_190 [2];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [2];
  float afStack_130 [2];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [2];
  float afStack_70 [2];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_78c = *(int *)((long)in_RSI + 0x2c);
  local_790 = (int)in_RSI[6];
  local_794 = *(int *)((long)in_RSI + 0x34);
  local_798 = (int)in_RSI[3];
  local_79c = (int)in_RSI[7];
  local_7a0 = local_78c * local_790 * local_794 * local_798;
  local_780 = in_RSI;
  for (local_7a4 = 0; local_7a4 < local_79c; local_7a4 = local_7a4 + 1) {
    local_760 = &local_7f8;
    local_42c = *(int *)((long)local_780 + 0x2c);
    local_430 = (int)local_780[6];
    local_434 = *(undefined4 *)((long)local_780 + 0x34);
    local_440 = (undefined1 (*) [16])(*local_780 + local_780[8] * (long)local_7a4 * local_780[2]);
    local_448 = local_780[2];
    local_44c = (undefined4)local_780[3];
    local_458 = local_780[4];
    local_428 = &local_7f8;
    local_418 = (long)local_42c * (long)local_430 * local_448;
    local_758 = &local_7f8;
    local_748 = &local_7f8;
    local_41c = 0x10;
    local_76c = local_7a4;
    local_76d = 1;
    local_7f8 = 0;
    local_7e8 = 0;
    local_7e0 = 0;
    local_7d0 = 0;
    local_7cc = 0;
    local_7c8 = 0;
    local_7c4 = 0;
    local_7c0 = 0;
    local_7b8 = 0;
    local_7f0 = 0;
    local_808 = 0;
    local_738 = 0;
    uStack_730 = 0;
    local_6d4 = 0x3f800000;
    local_6e8 = 0x3f800000;
    uStack_6e4 = 0x3f800000;
    uStack_6e0 = 0x3f800000;
    uStack_6dc = 0x3f800000;
    local_708 = *(float *)(in_RDI + 0xd0);
    local_728 = *(float *)(in_RDI + 0xd4);
    auVar3._4_4_ = local_728;
    auVar3._0_4_ = local_728;
    auVar3._12_4_ = local_728;
    auVar3._8_4_ = local_728;
    local_7b0 = local_440;
    for (; local_808 + 3 < local_7a0; local_808 = local_808 + 4) {
      local_6d0 = local_7b0;
      local_6c8 = *(undefined8 *)*local_7b0;
      uStack_6c0 = *(undefined8 *)(*local_7b0 + 8);
      local_6b8 = 0;
      uStack_6b0 = 0;
      auVar6 = maxps(ZEXT816(0),*local_7b0);
      local_698 = 0;
      uStack_690 = 0;
      auVar7 = minps(ZEXT816(0),*local_7b0);
      local_878 = auVar7._0_8_;
      uStack_870 = auVar7._8_8_;
      local_608 = 0;
      uStack_600 = 0;
      local_658 = 0x3f8000003f800000;
      uStack_650 = 0x3f8000003f800000;
      local_5c8 = local_878;
      uStack_5c0 = uStack_870;
      local_5d8 = 0x42b0c0a542b0c0a5;
      uStack_5d0 = 0x42b0c0a542b0c0a5;
      auVar8._8_8_ = 0x42b0c0a542b0c0a5;
      auVar8._0_8_ = 0x42b0c0a542b0c0a5;
      auVar8 = minps(auVar7,auVar8);
      local_618 = auVar8._0_8_;
      local_5e8 = local_618;
      uStack_610 = auVar8._8_8_;
      uStack_5e0 = uStack_610;
      local_5f8 = 0xc2b0c0a5c2b0c0a5;
      uStack_5f0 = 0xc2b0c0a5c2b0c0a5;
      auVar7._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7 = maxps(auVar8,auVar7);
      local_618 = auVar7._0_8_;
      uVar1 = local_618;
      uStack_610 = auVar7._8_8_;
      uVar2 = uStack_610;
      local_538 = 0x3fb8aa3b3fb8aa3b;
      uStack_530 = 0x3fb8aa3b3fb8aa3b;
      local_528._0_4_ = auVar7._0_4_;
      local_528._4_4_ = auVar7._4_4_;
      uStack_520._0_4_ = auVar7._8_4_;
      uStack_520._4_4_ = auVar7._12_4_;
      local_4a8 = CONCAT44(local_528._4_4_ * 1.442695,(float)local_528 * 1.442695);
      uStack_4a0 = CONCAT44(uStack_520._4_4_ * 1.442695,(float)uStack_520 * 1.442695);
      local_4b8 = 0x3f0000003f000000;
      uStack_4b0 = 0x3f0000003f000000;
      fVar4 = (float)local_528 * 1.442695 + 0.5;
      fVar9 = local_528._4_4_ * 1.442695 + 0.5;
      fVar10 = (float)uStack_520 * 1.442695 + 0.5;
      fVar11 = uStack_520._4_4_ * 1.442695 + 0.5;
      local_3b8 = CONCAT44(fVar9,fVar4);
      uStack_3b0 = CONCAT44(fVar11,fVar10);
      local_3a8 = CONCAT44((int)fVar9,(int)fVar4);
      uStack_3a0 = CONCAT44((int)fVar11,(int)fVar10);
      local_638 = (float)(int)fVar4;
      fStack_634 = (float)(int)fVar9;
      fStack_630 = (float)(int)fVar10;
      fStack_62c = (float)(int)fVar11;
      local_628 = CONCAT44(fStack_634,local_638);
      uStack_620 = CONCAT44(fStack_62c,fStack_630);
      local_388 = local_628;
      uStack_380 = uStack_620;
      local_398 = CONCAT44(fVar9,fVar4);
      uStack_390 = CONCAT44(fVar11,fVar10);
      local_668 = CONCAT44(-(uint)(fVar9 < fStack_634),-(uint)(fVar4 < local_638));
      uStack_660 = CONCAT44(-(uint)(fVar11 < fStack_62c),-(uint)(fVar10 < fStack_630));
      local_368 = local_668;
      uStack_360 = uStack_660;
      local_378 = 0x3f8000003f800000;
      uStack_370 = 0x3f8000003f800000;
      local_668 = local_668 & 0x3f8000003f800000;
      uStack_660 = uStack_660 & 0x3f8000003f800000;
      local_5a8 = local_628;
      uStack_5a0 = uStack_620;
      local_5b8._0_4_ = (float)local_668;
      local_5b8._4_4_ = (float)(local_668 >> 0x20);
      uStack_5b0._0_4_ = (float)uStack_660;
      uStack_5b0._4_4_ = (float)(uStack_660 >> 0x20);
      local_638 = local_638 - (float)local_5b8;
      fStack_634 = fStack_634 - local_5b8._4_4_;
      fStack_630 = fStack_630 - (float)uStack_5b0;
      fStack_62c = fStack_62c - uStack_5b0._4_4_;
      local_340 = &local_638;
      local_2e8 = ::_ps_cephes_exp_C1;
      local_350 = &local_618;
      local_2c8 = local_618;
      uStack_2c0 = uStack_610;
      local_2a8 = CONCAT44(fStack_634,local_638);
      uStack_2a0 = CONCAT44(fStack_62c,fStack_630);
      local_2b8[0] = 0.6933594;
      local_2b8[1] = 0.6933594;
      afStack_2b0[0] = 0.6933594;
      afStack_2b0[1] = 0.6933594;
      local_2d8 = local_638 * 0.6933594;
      fStack_2d4 = fStack_634 * 0.6933594;
      fStack_2d0 = fStack_630 * 0.6933594;
      fStack_2cc = fStack_62c * 0.6933594;
      local_618 = CONCAT44(local_528._4_4_ - fStack_2d4,(float)local_528 - local_2d8);
      uStack_610._0_4_ = (float)uStack_520 - fStack_2d0;
      uStack_610._4_4_ = uStack_520._4_4_ - fStack_2cc;
      local_348 = ::_ps_cephes_exp_C2;
      local_328 = local_618;
      uStack_320 = uStack_610;
      local_308 = CONCAT44(fStack_634,local_638);
      uStack_300 = CONCAT44(fStack_62c,fStack_630);
      local_318[0] = -0.00021219444;
      local_318[1] = -0.00021219444;
      afStack_310[0] = -0.00021219444;
      afStack_310[1] = -0.00021219444;
      local_338 = local_638 * -0.00021219444;
      fStack_334 = fStack_634 * -0.00021219444;
      fStack_330 = fStack_630 * -0.00021219444;
      fStack_32c = fStack_62c * -0.00021219444;
      fVar4 = ((float)local_528 - local_2d8) - local_338;
      fVar9 = (local_528._4_4_ - fStack_2d4) - fStack_334;
      fVar10 = ((float)uStack_520 - fStack_2d0) - fStack_330;
      fVar11 = (uStack_520._4_4_ - fStack_2cc) - fStack_32c;
      local_618 = CONCAT44(fVar9,fVar4);
      uStack_610._0_4_ = fVar10;
      uStack_610._4_4_ = fVar11;
      local_558 = local_618;
      uStack_550 = uStack_610;
      local_628 = CONCAT44(fVar9 * fVar9,fVar4 * fVar4);
      uStack_620 = CONCAT44(fVar11 * fVar11,fVar10 * fVar10);
      local_280 = &local_678;
      local_b0 = ::_ps_cephes_exp_p1;
      local_88 = 0x3950696739506967;
      uStack_80 = 0x3950696739506967;
      local_98 = local_618;
      uStack_90 = uStack_610;
      local_68 = fVar4 * 0.00019875691;
      fStack_64 = fVar9 * 0.00019875691;
      fStack_60 = fVar10 * 0.00019875691;
      fStack_5c = fVar11 * 0.00019875691;
      local_78[0] = 0.0013981999;
      local_78[1] = 0.0013981999;
      afStack_70[0] = 0.0013981999;
      afStack_70[1] = 0.0013981999;
      local_678 = CONCAT44(fStack_64 + 0.0013981999,local_68 + 0.0013981999);
      uStack_670 = CONCAT44(fStack_5c + 0.0013981999,fStack_60 + 0.0013981999);
      local_110 = ::_ps_cephes_exp_p2;
      local_e8 = local_678;
      uStack_e0 = uStack_670;
      local_f8 = local_618;
      uStack_f0 = uStack_610;
      local_c8 = (local_68 + 0.0013981999) * fVar4;
      fStack_c4 = (fStack_64 + 0.0013981999) * fVar9;
      fStack_c0 = (fStack_60 + 0.0013981999) * fVar10;
      fStack_bc = (fStack_5c + 0.0013981999) * fVar11;
      local_d8[0] = 0.008333452;
      local_d8[1] = 0.008333452;
      afStack_d0[0] = 0.008333452;
      afStack_d0[1] = 0.008333452;
      local_678 = CONCAT44(fStack_c4 + 0.008333452,local_c8 + 0.008333452);
      uStack_670 = CONCAT44(fStack_bc + 0.008333452,fStack_c0 + 0.008333452);
      local_170 = ::_ps_cephes_exp_p3;
      local_148 = local_678;
      uStack_140 = uStack_670;
      local_158 = local_618;
      uStack_150 = uStack_610;
      local_128 = (local_c8 + 0.008333452) * fVar4;
      fStack_124 = (fStack_c4 + 0.008333452) * fVar9;
      fStack_120 = (fStack_c0 + 0.008333452) * fVar10;
      fStack_11c = (fStack_bc + 0.008333452) * fVar11;
      local_138[0] = 0.041665796;
      local_138[1] = 0.041665796;
      afStack_130[0] = 0.041665796;
      afStack_130[1] = 0.041665796;
      local_678 = CONCAT44(fStack_124 + 0.041665796,local_128 + 0.041665796);
      uStack_670 = CONCAT44(fStack_11c + 0.041665796,fStack_120 + 0.041665796);
      local_1d0 = ::_ps_cephes_exp_p4;
      local_1a8 = local_678;
      uStack_1a0 = uStack_670;
      local_1b8 = local_618;
      uStack_1b0 = uStack_610;
      local_188 = (local_128 + 0.041665796) * fVar4;
      fStack_184 = (fStack_124 + 0.041665796) * fVar9;
      fStack_180 = (fStack_120 + 0.041665796) * fVar10;
      fStack_17c = (fStack_11c + 0.041665796) * fVar11;
      local_198[0] = 0.16666666;
      local_198[1] = 0.16666666;
      afStack_190[0] = 0.16666666;
      afStack_190[1] = 0.16666666;
      local_678 = CONCAT44(fStack_184 + 0.16666666,local_188 + 0.16666666);
      uStack_670 = CONCAT44(fStack_17c + 0.16666666,fStack_180 + 0.16666666);
      local_230 = ::_ps_cephes_exp_p5;
      local_208 = local_678;
      uStack_200 = uStack_670;
      local_218 = local_618;
      uStack_210 = uStack_610;
      local_1e8 = (local_188 + 0.16666666) * fVar4;
      fStack_1e4 = (fStack_184 + 0.16666666) * fVar9;
      fStack_1e0 = (fStack_180 + 0.16666666) * fVar10;
      fStack_1dc = (fStack_17c + 0.16666666) * fVar11;
      local_1f8[0] = 0.5;
      local_1f8[1] = 0.5;
      afStack_1f0[0] = 0.5;
      afStack_1f0[1] = 0.5;
      local_678 = CONCAT44(fStack_1e4 + 0.5,local_1e8 + 0.5);
      uStack_670 = CONCAT44(fStack_1dc + 0.5,fStack_1e0 + 0.5);
      local_288 = &local_628;
      local_268 = local_678;
      uStack_260 = uStack_670;
      local_278 = local_628;
      uStack_270 = uStack_620;
      local_248 = (local_1e8 + 0.5) * fVar4 * fVar4;
      fStack_244 = (fStack_1e4 + 0.5) * fVar9 * fVar9;
      fStack_240 = (fStack_1e0 + 0.5) * fVar10 * fVar10;
      fStack_23c = (fStack_1dc + 0.5) * fVar11 * fVar11;
      local_258 = local_618;
      uStack_250 = uStack_610;
      local_678 = CONCAT44(fStack_244 + fVar9,local_248 + fVar4);
      uStack_670 = CONCAT44(fStack_23c + fVar11,fStack_240 + fVar10);
      local_4c8 = local_678;
      uStack_4c0 = uStack_670;
      local_4d8 = 0x3f8000003f800000;
      uStack_4d0 = 0x3f8000003f800000;
      local_518 = local_248 + fVar4 + 1.0;
      fStack_514 = fStack_244 + fVar9 + 1.0;
      fStack_510 = fStack_240 + fVar10 + 1.0;
      fStack_50c = fStack_23c + fVar11 + 1.0;
      local_678 = CONCAT44(fStack_514,local_518);
      uStack_670 = CONCAT44(fStack_50c,fStack_510);
      local_3c8 = CONCAT44(fStack_634,local_638);
      uStack_3c0 = CONCAT44(fStack_62c,fStack_630);
      local_48 = CONCAT44((int)fStack_634,(int)local_638);
      uStack_40 = CONCAT44((int)fStack_62c,(int)fStack_630);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar5 = (int)local_638 + 0x7f;
      fStack_644 = (float)((int)fStack_634 + 0x7f);
      fStack_640 = (float)((int)fStack_630 + 0x7f);
      fStack_63c = (float)((int)fStack_62c + 0x7f);
      local_28 = CONCAT44(fStack_644,iVar5);
      uStack_20 = CONCAT44(fStack_63c,fStack_640);
      local_2c = 0x17;
      local_648 = (float)(iVar5 * 0x800000);
      local_688 = CONCAT44(fStack_644,local_648);
      uStack_680 = CONCAT44(fStack_63c,fStack_640);
      local_568 = local_678;
      uStack_560 = uStack_670;
      local_518 = local_518 * local_648;
      fStack_514 = fStack_514 * fStack_644;
      fStack_510 = fStack_510 * fStack_640;
      fStack_50c = fStack_50c * fStack_63c;
      local_678 = CONCAT44(fStack_514,local_518);
      uStack_670 = CONCAT44(fStack_50c,fStack_510);
      local_588 = local_678;
      uStack_580 = uStack_670;
      local_518 = local_518 - 1.0;
      fStack_514 = fStack_514 - 1.0;
      fStack_510 = fStack_510 - 1.0;
      fStack_50c = fStack_50c - 1.0;
      local_888 = CONCAT44(fStack_514,local_518);
      uStack_880 = CONCAT44(fStack_50c,fStack_510);
      local_4f8 = local_888;
      uStack_4f0 = uStack_880;
      local_518 = local_708 * local_518;
      fStack_514 = local_708 * fStack_514;
      fStack_510 = local_708 * fStack_510;
      fStack_50c = local_708 * fStack_50c;
      local_888 = CONCAT44(fStack_514,local_518);
      uStack_880 = CONCAT44(fStack_50c,fStack_510);
      local_868 = auVar6._0_8_;
      uStack_860 = auVar6._8_8_;
      local_498 = local_888;
      uStack_490 = uStack_880;
      local_488._0_4_ = auVar6._0_4_;
      local_488._4_4_ = auVar6._4_4_;
      uStack_480._0_4_ = auVar6._8_4_;
      uStack_480._4_4_ = auVar6._12_4_;
      local_518 = (float)local_488 + local_518;
      fStack_514 = local_488._4_4_ + fStack_514;
      fStack_510 = (float)uStack_480 + fStack_510;
      fStack_50c = uStack_480._4_4_ + fStack_50c;
      local_888 = CONCAT44(local_728 * fStack_514,local_728 * local_518);
      uStack_880 = CONCAT44(local_728 * fStack_50c,local_728 * fStack_510);
      local_460 = local_7b0;
      local_478 = local_888;
      uStack_470 = uStack_880;
      *(undefined8 *)*local_7b0 = local_888;
      *(undefined8 *)(*local_7b0 + 8) = uStack_880;
      local_7b0 = local_7b0 + 1;
      local_6a8 = local_6c8;
      uStack_6a0 = uStack_6c0;
      local_5b8 = local_668;
      uStack_5b0 = uStack_660;
      local_598 = 0x3f8000003f800000;
      uStack_590 = 0x3f8000003f800000;
      local_578 = local_688;
      uStack_570 = uStack_680;
      local_548 = local_558;
      uStack_540 = uStack_550;
      local_528 = uVar1;
      uStack_520 = uVar2;
      local_508 = auVar3;
      local_4e8 = CONCAT44(local_708,local_708);
      uStack_4e0 = CONCAT44(local_708,local_708);
      local_488 = local_868;
      uStack_480 = uStack_860;
      local_2f0 = local_350;
      local_2e0 = local_340;
      local_290 = local_350;
      local_228 = local_350;
      local_220 = local_280;
      local_1c8 = local_350;
      local_1c0 = local_280;
      local_168 = local_350;
      local_160 = local_280;
      local_108 = local_350;
      local_100 = local_280;
      local_a8 = local_350;
      local_a0 = local_280;
      local_18 = local_688;
      uStack_10 = uStack_680;
    }
    fVar4 = *(float *)(in_RDI + 0xd0);
    fVar9 = *(float *)(in_RDI + 0xd4);
    fStack_724 = local_728;
    fStack_720 = local_728;
    fStack_71c = local_728;
    local_718 = local_728;
    fStack_704 = local_708;
    fStack_700 = local_708;
    fStack_6fc = local_708;
    local_6ec = local_708;
    local_3f8 = local_748;
    local_7d8 = local_458;
    for (; local_808 < local_7a0; local_808 = local_808 + 1) {
      if (0.0 < *(float *)*local_7b0 || *(float *)*local_7b0 == 0.0) {
        *(float *)*local_7b0 = *(float *)*local_7b0 * *(float *)(in_RDI + 0xd4);
      }
      else {
        fVar10 = expf(*(float *)*local_7b0);
        *(float *)*local_7b0 = (fVar10 - 1.0) * fVar4 * fVar9;
      }
      local_7b0 = (undefined1 (*) [16])(*local_7b0 + 4);
    }
  }
  return 0;
}

Assistant:

int SELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}